

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::insert
          (QMovableArrayOps<QVariant> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QVariant **ppQVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_80;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_58,t);
  bVar3 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size != 0;
  QArrayDataPointer<QVariant>::detachAndGrow
            ((QArrayDataPointer<QVariant> *)this,(uint)(i == 0 && bVar3),n,(QVariant **)0x0,
             (QArrayDataPointer<QVariant> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      ::QVariant::QVariant
                ((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr + -1
                 ,(QVariant *)&local_58);
      ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QVariant> *)this,i,n);
    Inserter::insertFill(&local_80,(QVariant *)&local_58,n);
    Inserter::~Inserter(&local_80);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }